

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

bool __thiscall
Diligent::DearchiverBase::UnpackPSOSignatures<Diligent::TilePipelineStateCreateInfo>
          (DearchiverBase *this,PSOData<Diligent::TilePipelineStateCreateInfo> *PSO,
          IRenderDevice *pRenderDevice)

{
  iterator __position;
  IPipelineResourceSignature **ppIVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  RefCntAutoPtr<Diligent::IPipelineResourceSignature> pSignature;
  ResourceSignatureUnpackInfo UnpackInfo;
  RefCntAutoPtr<Diligent::IPipelineResourceSignature> local_60;
  string local_58;
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
  *local_38;
  
  uVar3 = (ulong)(PSO->CreateInfo).super_PipelineStateCreateInfo.ResourceSignaturesCount;
  if (uVar3 == 0) {
    FormatString<char[91]>
              (&local_58,
               (char (*) [91])
               "PSO must have at least one resource signature (including PSOs that use implicit signature)"
              );
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"UnpackPSOSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x113);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               local_58.field_2._M_allocated_capacity._0_4_) + 1);
    }
    bVar4 = true;
  }
  else {
    ppIVar1 = (IPipelineResourceSignature **)
              DynamicLinearAllocator::Allocate(&PSO->Allocator,uVar3 * 8,8);
    (PSO->CreateInfo).super_PipelineStateCreateInfo.ppResourceSignatures = ppIVar1;
    local_38 = (vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&PSO->Objects;
    uVar2 = 0;
    do {
      local_58._M_string_length = (size_type)(PSO->PRSNames)._M_elems[uVar2];
      local_58.field_2._M_allocated_capacity._0_4_ =
           (PSO->CreateInfo).super_PipelineStateCreateInfo.PSODesc.SRBAllocationGranularity;
      local_58._M_dataplus._M_p = (pointer)pRenderDevice;
      (*(this->super_ObjectBase<Diligent::IDearchiver>).
        super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject._vptr_IObject
        [0xe])(&local_60,this,&local_58,
               (ulong)((PSO->InternalCI).Flags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0));
      if (local_60.m_pObject == (IPipelineResourceSignature *)0x0) {
        return false;
      }
      ppIVar1[uVar2] = local_60.m_pObject;
      __position._M_current =
           (PSO->Objects).
           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (PSO->Objects).
          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
        ::_M_realloc_insert<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>>
                  (local_38,__position,&local_60);
      }
      else {
        (__position._M_current)->m_pObject = &(local_60.m_pObject)->super_IDeviceObject;
        local_60.m_pObject = (IPipelineResourceSignature *)0x0;
        (PSO->Objects).
        super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (local_60.m_pObject != (IPipelineResourceSignature *)0x0) {
        (*((local_60.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
        local_60.m_pObject = (IPipelineResourceSignature *)0x0;
      }
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    bVar4 = uVar3 <= uVar2;
  }
  return bVar4;
}

Assistant:

bool DearchiverBase::UnpackPSOSignatures(PSOData<CreateInfoType>& PSO, IRenderDevice* pRenderDevice)
{
    const Uint32 ResourceSignaturesCount = PSO.CreateInfo.ResourceSignaturesCount;
    if (ResourceSignaturesCount == 0)
    {
        UNEXPECTED("PSO must have at least one resource signature (including PSOs that use implicit signature)");
        return true;
    }
    IPipelineResourceSignature** const ppResourceSignatures = PSO.Allocator.template Allocate<IPipelineResourceSignature*>(ResourceSignaturesCount);

    PSO.CreateInfo.ppResourceSignatures = ppResourceSignatures;
    for (Uint32 i = 0; i < ResourceSignaturesCount; ++i)
    {
        ResourceSignatureUnpackInfo UnpackInfo{pRenderDevice, PSO.PRSNames[i]};
        UnpackInfo.SRBAllocationGranularity = PSO.CreateInfo.PSODesc.SRBAllocationGranularity;

        auto pSignature = UnpackResourceSignature(UnpackInfo, (PSO.InternalCI.Flags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0);
        if (!pSignature)
            return false;

        ppResourceSignatures[i] = pSignature;
        PSO.Objects.emplace_back(std::move(pSignature));
    }
    return true;
}